

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O1

ostream * test_detail::print_tuple_impl<std::tuple<int,char_const*,int>,0ul,1ul,2ul>
                    (ostream *stream,int *t)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
  std::ostream::operator<<(stream,t[4]);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  __s = *(char **)(t + 2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  std::ostream::operator<<(stream,*t);
  std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }